

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void golf_thread_timer_init(golf_thread_timer_t *timer)

{
  golf_thread_timer_t *timer_local;
  
  return;
}

Assistant:

void golf_thread_timer_init(golf_thread_timer_t* timer) {
#if GOLF_PLATFORM_WINDOWS

    // Compile-time size check
#pragma warning( push )
#pragma warning( disable: 4214 ) // nonstandard extension used: bit field types other than int
    struct x { char thread_timer_type_too_small : ( sizeof( golf_thread_timer_t ) < sizeof( HANDLE ) ? 0 : 1 ); }; 
#pragma warning( pop )

    TIMECAPS tc;
    if( timeGetDevCaps( &tc, sizeof( TIMECAPS ) ) == TIMERR_NOERROR ) 
        timeBeginPeriod( tc.wPeriodMin );

    *(HANDLE*)timer = CreateWaitableTimer( NULL, TRUE, NULL );

#elif GOLF_PLATFORM_LINUX || GOLF_PLATFORM_IOS || GOLF_PLATFORM_ANDROID || GOLF_PLATFORM_EMSCRIPTEN
    GOLF_UNUSED(timer);

    // Nothing

#else 
#error Unknown platform.
#endif
}